

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O2

void __thiscall
miniros::TransportPublisherLink::onMessageLength
          (TransportPublisherLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  uint __fd;
  Connection *this_00;
  undefined4 in_register_0000000c;
  size_t __nbytes;
  allocator<char> local_41;
  undefined1 local_40 [16];
  code *local_30;
  code *local_28;
  
  __nbytes = CONCAT44(in_register_0000000c,size);
  if (this->retry_timer_handle_ != -1) {
    getInternalTimerManager();
    TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::remove
              ((TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>
                *)local_40._0_8_,(char *)(ulong)(uint)this->retry_timer_handle_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    this->retry_timer_handle_ = -1;
  }
  local_40._0_8_ = this;
  if (success) {
    __fd = *(uint *)(buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (1000000000 < __fd) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (onMessageLength::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_40,"miniros.transport_publisher_link",&local_41);
        console::initializeLogLocation(&onMessageLength::loc,(string *)local_40,Error);
        std::__cxx11::string::~string((string *)local_40);
      }
      if (onMessageLength::loc.level_ != Error) {
        console::setLogLocationLevel(&onMessageLength::loc,Error);
        console::checkLogLocationEnabled(&onMessageLength::loc);
      }
      if (onMessageLength::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,onMessageLength::loc.logger_,onMessageLength::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                       ,0xd5,
                       "void miniros::TransportPublisherLink::onMessageLength(const ConnectionPtr &, const std::shared_ptr<uint8_t[]> &, uint32_t, bool)"
                       ,
                       "a message of over a gigabyte was predicted in tcpros. that seems highly unlikely, so I\'ll assume protocol synchronization is lost."
                      );
      }
      (*(this->super_PublisherLink)._vptr_PublisherLink[5])(this);
      return;
    }
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:219:5)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:219:5)>
               ::_M_manager;
    Connection::read((this->connection_).
                     super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,local_40,__nbytes);
  }
  else {
    this_00 = (this->connection_).
              super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 == (Connection *)0x0) {
      return;
    }
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:195:9)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:195:9)>
               ::_M_manager;
    Connection::read(this_00,4,local_40,__nbytes);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  return;
}

Assistant:

void TransportPublisherLink::onMessageLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)conn;
  (void)size;
  if (retry_timer_handle_ != -1)
  {
    getInternalTimerManager()->remove(retry_timer_handle_);
    retry_timer_handle_ = -1;
  }

  if (!success)
  {
    if (connection_) {
      connection_->read(4,
        [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
        {
          this->onMessageLength(conn, buffer, size, success);
        });
    }
    return;
  }

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    drop();
    return;
  }

  connection_->read(len,
    [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
    {
      this->onMessage(conn, buffer, size, success);
    });
}